

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error __thiscall
asmjit::X86RAPass::emitImmToStack(X86RAPass *this,uint32_t dstTypeId,X86Mem *dst,Imm *src)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *in_RCX;
  ulong *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  uint32_t hi;
  uint32_t gpSize;
  Imm imm;
  X86Mem mem;
  Operand_ *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined8 in_stack_fffffffffffffdf8;
  uint32_t instId;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined1 uVar5;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  ulong *local_120;
  long local_118;
  undefined4 local_10c;
  ulong *local_108;
  undefined4 local_fc;
  ulong *local_f8;
  undefined4 local_ec;
  ulong *local_e8;
  undefined8 *local_e0;
  uint local_d4;
  ulong *local_d0;
  uint local_c4;
  undefined8 *local_c0;
  long local_b0;
  long local_a8;
  undefined8 *local_98;
  undefined8 *local_88;
  ulong *local_78;
  ulong *local_68;
  ulong *local_58;
  long local_50;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  ulong *local_38;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  ulong *local_20;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  ulong *local_8;
  
  instId = (uint32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_120 = &local_1b8;
  uVar3 = *in_RDX;
  uStack_1b0 = in_RDX[1];
  local_150 = &local_1c8;
  local_1c8 = *in_RCX;
  uVar4 = in_RCX[1];
  local_118 = *(long *)(in_RDI + 8);
  local_a8 = local_118 + 8;
  bVar1 = *(byte *)(local_118 + 10);
  uStack_1c0 = uVar4;
  local_b0 = local_118;
  local_98 = local_150;
  local_88 = local_150;
  local_78 = local_120;
  local_68 = local_120;
  local_58 = local_120;
  local_50 = local_a8;
  switch(in_ESI) {
  case 0x22:
  case 0x23:
    local_148 = &local_1c8;
    uStack_1c0 = uVar4 & 0xff;
  case 0x24:
  case 0x25:
    local_140 = &local_1c8;
    uStack_1c0 = uStack_1c0 & 0xffff;
  case 0x26:
  case 0x27:
  case 0x2a:
    local_e8 = &local_1b8;
    local_ec = 4;
    local_3c = 4;
    local_40 = 0xff;
    local_44 = 0x18;
    local_1b8 = uVar3 & 0xffffffff00ffffff | 0x4000000;
    local_130 = &local_1c8;
    uStack_1c0 = uStack_1c0 & 0xffffffff;
    local_38 = local_e8;
    CodeEmitter::emit((CodeEmitter *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                      instId,(Operand_ *)
                             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      in_stack_fffffffffffffde8);
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x31:
  case 0x32:
    if (bVar1 == 4) {
      local_e0 = &local_1c8;
      uStack_1c0._4_4_ = (uint)(uVar4 >> 0x20);
      uVar2 = uStack_1c0._4_4_;
      local_f8 = &local_1b8;
      local_fc = 4;
      local_24 = 4;
      local_28 = 0xff;
      local_2c = 0x18;
      local_2c._0_1_ = 0x18;
      local_1b8 = uVar3 & 0xffffffff00ffffff | 0x4000000;
      local_138 = &local_1c8;
      uStack_1c0 = uVar4 & 0xffffffff;
      uVar5 = (undefined1)local_2c;
      local_20 = local_f8;
      CodeEmitter::emit((CodeEmitter *)CONCAT17(0x18,in_stack_fffffffffffffe00),instId,
                        (Operand_ *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffde8);
      local_d0 = &local_1b8;
      uStack_1b0 = CONCAT44(uStack_1b0._4_4_,(int)uStack_1b0 + 4);
      local_c0 = &local_1c8;
      uStack_1c0 = (ulong)uVar2;
      local_d4 = (uint)bVar1;
      local_c4 = uVar2;
      CodeEmitter::emit((CodeEmitter *)CONCAT17(uVar5,in_stack_fffffffffffffe00),instId,
                        (Operand_ *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffde8);
    }
    else {
      local_108 = &local_1b8;
      local_10c = 8;
      local_c = 8;
      local_10 = 0xff;
      local_14 = 0x18;
      local_1b8 = uVar3 & 0xffffffff00ffffff | 0x8000000;
      local_8 = local_108;
      CodeEmitter::emit((CodeEmitter *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00)
                        ,(uint32_t)((ulong)local_108 >> 0x20),
                        (Operand_ *)CONCAT17(0x18,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffde8);
    }
    break;
  default:
    return 4;
  }
  return 0;
}

Assistant:

Error X86RAPass::emitImmToStack(uint32_t dstTypeId, const X86Mem* dst, const Imm* src) noexcept {
  X86Mem mem(*dst);
  Imm imm(*src);

  // One stack entry has the same size as the native register size. That means
  // that if we want to move a 32-bit integer on the stack in 64-bit mode, we
  // need to extend it to a 64-bit integer first. In 32-bit mode, pushing a
  // 64-bit on stack is done in two steps by pushing low and high parts
  // separately.
  uint32_t gpSize = cc()->getGpSize();

  switch (dstTypeId) {
    case TypeId::kI8:
    case TypeId::kU8:
      imm.truncateTo8Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI16:
    case TypeId::kU16:
      imm.truncateTo16Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
    case TypeId::kF32:
      mem.setSize(4);
      imm.truncateTo32Bits();
      cc()->emit(X86Inst::kIdMov, mem, imm);
      break;

    case TypeId::kI64:
    case TypeId::kU64:
    case TypeId::kF64:
    case TypeId::kMmx32:
    case TypeId::kMmx64:
      if (gpSize == 4) {
        uint32_t hi = imm.getUInt32Hi();

        // Lo-Part.
        mem.setSize(4);
        imm.truncateTo32Bits();

        cc()->emit(X86Inst::kIdMov, mem, imm);
        mem.addOffsetLo32(gpSize);

        // Hi-Part.
        imm.setUInt32(hi);
        cc()->emit(X86Inst::kIdMov, mem, imm);
      }
      else {
        mem.setSize(8);
        cc()->emit(X86Inst::kIdMov, mem, imm);
      }
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  return kErrorOk;
}